

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Totals * __thiscall
Catch::Runner::runTestsForGroup
          (Totals *__return_storage_ptr__,Runner *this,RunContext *context,
          TestCaseFilters *filterGroup)

{
  TestCase *pTVar1;
  IStreamingReporter *pIVar2;
  bool bVar3;
  int iVar4;
  IRegistryHub *pIVar5;
  undefined4 extraout_var;
  undefined8 *puVar6;
  undefined4 extraout_var_00;
  long lVar7;
  iterator iVar8;
  TestCase *testCase;
  Totals local_50;
  
  (__return_storage_ptr__->testCases).passed = 0;
  (__return_storage_ptr__->testCases).failed = 0;
  (__return_storage_ptr__->assertions).passed = 0;
  (__return_storage_ptr__->assertions).failed = 0;
  pIVar5 = getRegistryHub();
  iVar4 = (*pIVar5->_vptr_IRegistryHub[3])(pIVar5);
  puVar6 = (undefined8 *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x10))
                     ((long *)CONCAT44(extraout_var,iVar4));
  testCase = (TestCase *)*puVar6;
  pIVar5 = getRegistryHub();
  iVar4 = (*pIVar5->_vptr_IRegistryHub[3])(pIVar5);
  lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x10))
                    ((long *)CONCAT44(extraout_var_00,iVar4));
  pTVar1 = *(TestCase **)(lVar7 + 8);
  iVar4 = 0;
  for (; testCase != pTVar1; testCase = testCase + 1) {
    bVar3 = TestCaseFilters::shouldInclude(filterGroup,testCase);
    if (bVar3) {
      iVar4 = iVar4 + 1;
      iVar8 = std::
              _Rb_tree<Catch::TestCase,_Catch::TestCase,_std::_Identity<Catch::TestCase>,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
              ::find(&(this->m_testsAlreadyRun)._M_t,testCase);
      if ((_Rb_tree_header *)iVar8._M_node ==
          &(this->m_testsAlreadyRun)._M_t._M_impl.super__Rb_tree_header) {
        bVar3 = RunContext::aborting(context);
        if (bVar3) break;
        RunContext::runTest(&local_50,context,testCase);
        Totals::operator+=(__return_storage_ptr__,&local_50);
        std::
        _Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
        ::_M_insert_unique<Catch::TestCase_const&>
                  ((_Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
                    *)&this->m_testsAlreadyRun,testCase);
      }
    }
  }
  if (iVar4 == 0) {
    std::__cxx11::string::string((string *)&local_50,(string *)&filterGroup->m_name);
    std::__cxx11::string::~string((string *)&local_50);
    if (local_50.assertions.failed != 0) {
      pIVar2 = (this->m_reporter).m_p;
      std::__cxx11::string::string((string *)&local_50,(string *)&filterGroup->m_name);
      (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[5])(pIVar2,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Totals runTestsForGroup( RunContext& context, const TestCaseFilters& filterGroup ) {
            Totals totals;
            std::vector<TestCase>::const_iterator it = getRegistryHub().getTestCaseRegistry().getAllTests().begin();
            std::vector<TestCase>::const_iterator itEnd = getRegistryHub().getTestCaseRegistry().getAllTests().end();
            int testsRunForGroup = 0;
            for(; it != itEnd; ++it ) {
                if( filterGroup.shouldInclude( *it ) ) {
                    testsRunForGroup++;
                    if( m_testsAlreadyRun.find( *it ) == m_testsAlreadyRun.end() ) {

                        if( context.aborting() )
                            break;

                        totals += context.runTest( *it );
                        m_testsAlreadyRun.insert( *it );
                    }
                }
            }
            if( testsRunForGroup == 0 && !filterGroup.getName().empty() )
                m_reporter->noMatchingTestCases( filterGroup.getName() );
            return totals;

        }